

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O2

void __thiscall
SequenceDistanceGraph::load_from_gfa1(SequenceDistanceGraph *this,ifstream *gfaf,ifstream *fastaf)

{
  vector<Node,_std::allocator<Node>_> *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *this_01;
  size_type sVar1;
  bool bVar2;
  mapped_type mVar3;
  int iVar4;
  ostream *poVar5;
  iterator iVar6;
  sgNodeID_t sVar7;
  mapped_type *pmVar8;
  istream *piVar9;
  mapped_type *pmVar10;
  iterator iVar11;
  runtime_error *this_02;
  logic_error *plVar12;
  long lVar13;
  int32_t d;
  ulong uVar14;
  long n1;
  long lVar15;
  ulong local_6e0;
  string gfa_source;
  string line;
  string gfa_dest;
  string gap_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  string name;
  string seq_location;
  string gfa_length;
  string gfa_cigar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  string gfa_destdir;
  string gfa_rtype;
  string gfa_star;
  string gfa_sourcedir;
  string seq;
  string gap_dir;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  gap_dist;
  string local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  Node local_410;
  Node local_3d8;
  istringstream gap_ss;
  Node local_220;
  Node local_1e8;
  istringstream iss;
  byte abStack_190 [352];
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  poVar5 = sdglib::OutputLog(INFO,true);
  poVar5 = std::operator<<(poVar5,"Graph fasta filesname: ");
  poVar5 = std::operator<<(poVar5,(string *)&this->fasta_filename);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = sdglib::OutputLog(INFO,true);
  poVar5 = std::operator<<(poVar5,"Loading sequences from ");
  poVar5 = std::operator<<(poVar5,(string *)&this->fasta_filename);
  std::endl<char,std::char_traits<char>>(poVar5);
  gap_dist._M_h._M_buckets = &gap_dist._M_h._M_single_bucket;
  gap_dist._M_h._M_bucket_count = 1;
  gap_dist._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  gap_dist._M_h._M_element_count = 0;
  gap_dist._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  gap_dist._M_h._M_rehash_policy._M_next_resize = 0;
  gap_dist._M_h._M_single_bucket = (__node_base_ptr)0x0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&seq,"",(allocator *)&iss);
  std::__cxx11::string::reserve((ulong)&seq);
  this_01 = &this->oldnames_to_ids;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this_01->_M_h);
  std::__cxx11::string::string((string *)&iss,"",(allocator *)&gap_ss);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->oldnames,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss);
  std::__cxx11::string::~string((string *)&iss);
  this_00 = &this->nodes;
  std::vector<Node,_std::allocator<Node>_>::clear(this_00);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::clear(&(this->super_DistanceGraph).links);
  std::__cxx11::string::string((string *)&iss,"",(allocator *)&gap_ss);
  Node::Node(&local_3d8,(string *)&iss,Deleted);
  add_node(this,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&iss);
  while (((byte)fastaf[*(long *)(*(long *)fastaf + -0x18) + 0x20] & 2) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)fastaf,(string *)&line);
    if ((((byte)fastaf[*(long *)(*(long *)fastaf + -0x18) + 0x20] & 2) == 0) &&
       (*line._M_dataplus._M_p != '>')) {
      std::__cxx11::string::append((string *)&seq);
    }
    else {
      if (name._M_string_length != 0) {
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this_01->_M_h,&name);
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
            ._M_cur != (__node_type *)0x0) {
          plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gap_ss,"sequence ",&name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gap_ss," is already defined");
          std::logic_error::logic_error(plVar12,(string *)&iss);
          __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        Node::Node(&local_410,&seq);
        sVar7 = add_node(this,&local_410);
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_01,&name);
        *pmVar8 = sVar7;
        std::__cxx11::string::~string((string *)&local_410);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->oldnames,&name);
        bVar2 = Node::is_canonical((this->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + -1);
        if (!bVar2) {
          Node::make_rc((this->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_finish + -1);
          pmVar8 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_01,&name);
          lVar15 = *pmVar8;
          pmVar8 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_01,&name);
          *pmVar8 = -lVar15;
        }
      }
      name._M_string_length = 0;
      *name._M_dataplus._M_p = '\0';
      for (uVar14 = 1; (uVar14 < line._M_string_length && (line._M_dataplus._M_p[uVar14] != ' '));
          uVar14 = uVar14 + 1) {
        std::__cxx11::string::push_back((char)&name);
      }
      std::__cxx11::string::assign((char *)&seq);
    }
  }
  poVar5 = sdglib::OutputLog(INFO,true);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," nodes loaded (");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," canonised).");
  std::endl<char,std::char_traits<char>>(poVar5);
  gfa_rtype._M_dataplus._M_p = (pointer)&gfa_rtype.field_2;
  gfa_rtype._M_string_length = 0;
  uVar14 = 0;
  gfa_source._M_dataplus._M_p = (pointer)&gfa_source.field_2;
  gfa_source._M_string_length = 0;
  gfa_sourcedir._M_dataplus._M_p = (pointer)&gfa_sourcedir.field_2;
  gfa_sourcedir._M_string_length = 0;
  gfa_rtype.field_2._M_local_buf[0] = '\0';
  gfa_source.field_2._M_local_buf[0] = '\0';
  gfa_dest._M_dataplus._M_p = (pointer)&gfa_dest.field_2;
  gfa_dest._M_string_length = 0;
  gfa_destdir._M_dataplus._M_p = (pointer)&gfa_destdir.field_2;
  gfa_destdir._M_string_length = 0;
  gfa_sourcedir.field_2._M_local_buf[0] = '\0';
  gfa_dest.field_2._M_local_buf[0] = '\0';
  gfa_cigar._M_dataplus._M_p = (pointer)&gfa_cigar.field_2;
  gfa_cigar._M_string_length = 0;
  gfa_star._M_dataplus._M_p = (pointer)&gfa_star.field_2;
  gfa_star._M_string_length = 0;
  gfa_destdir.field_2._M_local_buf[0] = '\0';
  gfa_cigar.field_2._M_local_buf[0] = '\0';
  gfa_length._M_dataplus._M_p = (pointer)&gfa_length.field_2;
  gfa_length._M_string_length = 0;
  gap_id._M_dataplus._M_p = (pointer)&gap_id.field_2;
  gap_id._M_string_length = 0;
  gfa_star.field_2._M_local_buf[0] = '\0';
  gfa_length.field_2._M_local_buf[0] = '\0';
  gap_dir._M_dataplus._M_p = (pointer)&gap_dir.field_2;
  gap_dir._M_string_length = 0;
  seq_location._M_dataplus._M_p = (pointer)&seq_location.field_2;
  seq_location._M_string_length = 0;
  gap_id.field_2._M_local_buf[0] = '\0';
  gap_dir.field_2._M_local_buf[0] = '\0';
  seq_location.field_2._M_local_buf[0] = '\0';
  local_6e0 = 0;
  do {
    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)gfaf,(string *)&line);
    if ((((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) ||
       (((byte)gfaf[*(long *)(*(long *)gfaf + -0x18) + 0x20] & 2) != 0)) {
      if ((float)uVar14 * 0.5 < (float)local_6e0) {
        poVar5 = sdglib::OutputLog(WARN,true);
        poVar5 = std::operator<<(poVar5,"Warning: The loaded graph contains ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5," non-overlapping links out of ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      poVar5 = sdglib::OutputLog(INFO,true);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," nodes after connecting with ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," links.");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&seq_location);
      std::__cxx11::string::~string((string *)&gap_dir);
      std::__cxx11::string::~string((string *)&gap_id);
      std::__cxx11::string::~string((string *)&gfa_length);
      std::__cxx11::string::~string((string *)&gfa_star);
      std::__cxx11::string::~string((string *)&gfa_cigar);
      std::__cxx11::string::~string((string *)&gfa_destdir);
      std::__cxx11::string::~string((string *)&gfa_dest);
      std::__cxx11::string::~string((string *)&gfa_sourcedir);
      std::__cxx11::string::~string((string *)&gfa_source);
      std::__cxx11::string::~string((string *)&gfa_rtype);
      std::__cxx11::string::~string((string *)&seq);
      std::__cxx11::string::~string((string *)&name);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&gap_dist._M_h);
      std::__cxx11::string::~string((string *)&line);
      return;
    }
    std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
    std::operator>>((istream *)&iss,(string *)&gfa_rtype);
    bVar2 = std::operator==(&gfa_rtype,"S");
    if (bVar2) {
      std::operator>>((istream *)&iss,(string *)&gfa_source);
      std::operator>>((istream *)&iss,(string *)&gfa_star);
      std::operator>>((istream *)&iss,(string *)&gfa_length);
      if ((abStack_190[*(long *)(_iss + -0x18)] & 2) == 0) {
        std::operator>>((istream *)&iss,(string *)&seq_location);
      }
      bVar2 = std::operator!=(&gfa_star,"*");
      if (bVar2) {
        plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar12,"Sequences should be in a separate file.");
        __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      bVar2 = std::operator==(&gfa_star,"*");
      if ((bVar2) && (seq_location._M_string_length == 0)) {
        std::__cxx11::string::substr((ulong)&gap_ss,(ulong)&gfa_length);
        mVar3 = std::__cxx11::stoi((string *)&gap_ss,(size_t *)0x0,10);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&gap_dist,&gfa_source);
        *pmVar10 = mVar3;
        std::__cxx11::string::~string((string *)&gap_ss);
      }
      else {
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this_01->_M_h,&gfa_source);
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
            ._M_cur != (__node_type *)0x0) {
          std::__cxx11::string::substr((ulong)&gap_ss,(ulong)&gfa_length);
          iVar4 = std::__cxx11::stoi((string *)&gap_ss,(size_t *)0x0,10);
          pmVar8 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this_01,&gfa_source);
          lVar15 = *pmVar8;
          lVar13 = -lVar15;
          if (0 < lVar15) {
            lVar13 = lVar15;
          }
          sVar1 = (this_00->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar13].sequence._M_string_length;
          std::__cxx11::string::~string((string *)&gap_ss);
          if (sVar1 != (long)iVar4) {
            plVar12 = (logic_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_450,"Different length in node and fasta for sequence: ",
                           &gfa_source);
            std::operator+(&local_430,&local_450," -> gfa:");
            std::__cxx11::string::substr((ulong)&local_470,(ulong)&gfa_length);
            std::operator+(&local_5a8,&local_430,&local_470);
            std::operator+(&local_648,&local_5a8,", fasta: ");
            pmVar8 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_01,&gfa_source);
            std::__cxx11::to_string
                      (&local_490,
                       (this_00->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                       super__Vector_impl_data._M_start[*pmVar8].sequence._M_string_length);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &gap_ss,&local_648,&local_490);
            std::logic_error::logic_error(plVar12,(string *)&gap_ss);
            __cxa_throw(plVar12,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
        }
      }
      seq_location._M_string_length = 0;
      *seq_location._M_dataplus._M_p = '\0';
    }
    else {
      bVar2 = std::operator==(&gfa_rtype,"L");
      if (bVar2) {
        std::operator>>((istream *)&iss,(string *)&gfa_source);
        std::operator>>((istream *)&iss,(string *)&gfa_sourcedir);
        std::operator>>((istream *)&iss,(string *)&gfa_dest);
        std::operator>>((istream *)&iss,(string *)&gfa_destdir);
        std::operator>>((istream *)&iss,(string *)&gfa_cigar);
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&gap_dist._M_h,&gfa_dest);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
            ._M_cur != (__node_type *)0x0) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)gfaf,(string *)&line);
          std::__cxx11::istringstream::istringstream((istringstream *)&gap_ss,(string *)&line,_S_in)
          ;
          std::operator>>((istream *)&gap_ss,(string *)&gfa_rtype);
          std::operator>>((istream *)&gap_ss,(string *)&gap_id);
          std::operator>>((istream *)&gap_ss,(string *)&gap_dir);
          std::operator>>((istream *)&gap_ss,(string *)&gfa_dest);
          std::operator>>((istream *)&gap_ss,(string *)&gfa_destdir);
          std::operator>>((istream *)&gap_ss,(string *)&gfa_cigar);
          std::__cxx11::istringstream::~istringstream((istringstream *)&gap_ss);
        }
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&gap_dist._M_h,&gap_id);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          iVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this_01->_M_h,&gfa_source);
          if (iVar6.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__cxx11::string::string((string *)&gap_ss,"",(allocator *)&local_648);
            Node::Node(&local_1e8,(string *)&gap_ss);
            sVar7 = add_node(this,&local_1e8);
            pmVar8 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_01,&gfa_source);
            *pmVar8 = sVar7;
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&gap_ss);
          }
          iVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this_01->_M_h,&gfa_dest);
          if (iVar6.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__cxx11::string::string((string *)&gap_ss,"",(allocator *)&local_648);
            Node::Node(&local_220,(string *)&gap_ss);
            sVar7 = add_node(this,&local_220);
            pmVar8 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this_01,&gfa_dest);
            *pmVar8 = sVar7;
            std::__cxx11::string::~string((string *)&local_220);
            std::__cxx11::string::~string((string *)&gap_ss);
          }
        }
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_01,&gfa_source);
        lVar15 = *pmVar8;
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_01,&gfa_dest);
        lVar13 = *pmVar8;
        bVar2 = std::operator==(&gfa_sourcedir,"+");
        n1 = -lVar15;
        if (!bVar2) {
          n1 = lVar15;
        }
        bVar2 = std::operator==(&gfa_destdir,"-");
        lVar15 = -lVar13;
        if (!bVar2) {
          lVar15 = lVar13;
        }
        d = 0;
        if ((1 < gfa_cigar._M_string_length) &&
           (d = 0, gfa_cigar._M_dataplus._M_p[gfa_cigar._M_string_length - 1] == 'M')) {
          iVar4 = atoi(gfa_cigar._M_dataplus._M_p);
          d = -iVar4;
          local_6e0 = local_6e0 + (iVar4 < 1);
        }
        if (gap_id._M_string_length != 0) {
          iVar11 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&gap_dist._M_h,&gap_id);
          if (iVar11.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
              ._M_cur == (__node_type *)0x0) {
            this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_5a8,&gfa_dest," has not been seen in ");
            std::operator+(&local_648,&local_5a8,&this->filename);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &gap_ss,&local_648,
                           " yet, please ensure gaps are defined before being referenced");
            std::runtime_error::runtime_error(this_02,(string *)&gap_ss);
            __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          d = *(int32_t *)
               ((long)iVar11.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                      ._M_cur + 0x28);
          gap_id._M_string_length = 0;
          *gap_id._M_dataplus._M_p = '\0';
        }
        bVar2 = DistanceGraph::are_connected(&this->super_DistanceGraph,n1,lVar15);
        if (!bVar2) {
          DistanceGraph::add_link(&this->super_DistanceGraph,n1,lVar15,d,(Support)ZEXT816(0));
          uVar14 = uVar14 + 1;
        }
      }
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  } while( true );
}

Assistant:

void SequenceDistanceGraph::load_from_gfa1(std::ifstream &gfaf, std::ifstream &fastaf) {
    std::string line;
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Graph fasta filesname: " << fasta_filename << std::endl;
    //load all sequences from fasta file if they're not canonical, flip and remember they're flipped
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Loading sequences from " << fasta_filename << std::endl;

    std::unordered_map<std::string, unsigned int> gap_dist;
    std::string name, seq = "";
    seq.reserve(10000000); //stupid hack but probably useful to reserve
    oldnames_to_ids.clear();
    oldnames.push_back("");
    nodes.clear();
    links.clear();
    add_node(Node("",NodeStatus::Deleted)); //an empty deleted node on 0, just to skip the space
    sgNodeID_t nextid=1;
    uint64_t rcnodes=0;
    while(!fastaf.eof()){
        std::getline(fastaf,line);
        if (fastaf.eof() or line[0] == '>'){

            if (!name.empty()) {
                //rough ansi C and C++ mix but it works
                if (oldnames_to_ids.find(name) != oldnames_to_ids.end())
                    throw std::logic_error("sequence " + name + " is already defined");
                oldnames_to_ids[name] = add_node(Node(seq));
                oldnames.push_back(name);
                //reverse seq if not canonical
                if (!nodes.back().is_canonical()) {
                    nodes.back().make_rc();
                    oldnames_to_ids[name] = -oldnames_to_ids[name];
                    ++rcnodes;
                }
            }

            // Clear the name and set name to the new name, this is a new sequence!
            name.clear();
            for (auto i = 1; i < line.size() and line[i] != ' '; ++i) name += line[i];
            seq = "";
        } else {
            seq += line;

        }
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size()-1 << " nodes loaded (" << rcnodes << " canonised)." << std::endl;

    //load store all connections.

    std::string gfa_rtype,gfa_source,gfa_sourcedir,gfa_dest,gfa_destdir,gfa_cigar,gfa_star,gfa_length,gap_id,gap_dir,seq_location;
    sgNodeID_t src_id,dest_id;
    int32_t dist;
    uint64_t lcount=0;
    uint64_t dist_egt0(0);
    while(std::getline(gfaf, line) and !gfaf.eof()) {
        std::istringstream iss(line);
        iss >> gfa_rtype;

        if (gfa_rtype == "S") {
            iss >> gfa_source;
            iss >> gfa_star;
            iss >> gfa_length; // parse to number
            if (!iss.eof()) iss >> seq_location;
            if (gfa_star != "*") {
                throw std::logic_error("Sequences should be in a separate file.");
            }

            if (gfa_star == "*" and seq_location.empty()) {
                gap_dist[gfa_source] = std::stoi(gfa_length.substr(5));
            } else {
                // Check equal length seq and node length reported in gfa
                if (oldnames_to_ids.find(gfa_source) != oldnames_to_ids.end()) {
                    if (std::stoi(gfa_length.substr(5)) !=
                        nodes[std::abs(oldnames_to_ids[gfa_source])].sequence.length()) {
                        throw std::logic_error(
                                "Different length in node and fasta for sequence: " + gfa_source + " -> gfa:" +
                                gfa_length.substr(5) + ", fasta: " +
                                std::to_string(nodes[oldnames_to_ids[gfa_source]].sequence.length()));
                    }
                }
            }
            seq_location.clear();
        } else if (gfa_rtype == "L"){
            iss >> gfa_source;
            iss >> gfa_sourcedir;
            iss >> gfa_dest;
            iss >> gfa_destdir;
            iss >> gfa_cigar;

            if (gap_dist.find(gfa_dest) != gap_dist.end()) {
                std::getline(gfaf, line);
                std::istringstream gap_ss(line);
                gap_ss >> gfa_rtype;
                gap_ss >> gap_id;        // Ignore gap_id x2
                gap_ss >> gap_dir;     // Ignore gap_dir x2
                gap_ss >> gfa_dest;        // Read dest
                gap_ss >> gfa_destdir;     // Read dest_dir
                gap_ss >> gfa_cigar;       // Ignore cigar
            }
            //std::cout<<"'"<<source<<"' '"<<gfa_sourcedir<<"' '"<<dest<<"' '"<<destdir<<"'"<<std::endl;
            if (gap_dist.find(gap_id) == gap_dist.end()) {
                if (oldnames_to_ids.find(gfa_source) == oldnames_to_ids.end()) {
                    oldnames_to_ids[gfa_source] = add_node(Node(""));
                    //std::cout<<"added source!" <<source<<std::endl;
                }
                if (oldnames_to_ids.find(gfa_dest) == oldnames_to_ids.end()) {
                    oldnames_to_ids[gfa_dest] = add_node(Node(""));
                    //std::cout<<"added dest! "<<dest<<std::endl;
                }
            }
            src_id=oldnames_to_ids[gfa_source];
            dest_id=oldnames_to_ids[gfa_dest];

            //Go from GFA's "Links as paths" to a normal "nodes have sinks (-/start/left) and sources (+/end/right)
            if (gfa_sourcedir == "+") src_id=-src_id;
            if (gfa_destdir == "-") dest_id=-dest_id;
            dist=0;
            if (gfa_cigar.size()>1 and gfa_cigar[gfa_cigar.size()-1]=='M') {
                //TODO: better checks for M
                dist=-atoi(gfa_cigar.c_str());
                if (dist>=0) {
                    dist_egt0++;
                }
            }

            if (!gap_id.empty()) {
                const auto d = gap_dist.find(gap_id);
                if (d != gap_dist.cend()) {
                    dist = d->second;
                } else {
                    throw std::runtime_error(gfa_dest + " has not been seen in " + filename +
                                             " yet, please ensure gaps are defined before being referenced");
                }
                gap_id.clear();
            }
            if (not are_connected(src_id,dest_id)) {
                add_link(src_id, dest_id, dist);
                ++lcount;
            }
        }
    }
    if (dist_egt0 > lcount*0.5f) {
        sdglib::OutputLog(sdglib::LogLevels::WARN) << "Warning: The loaded graph contains " << dist_egt0 << " non-overlapping links out of " << lcount << std::endl;
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size() - 1 << " nodes after connecting with " << lcount << " links." << std::endl;
}